

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

int queue_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  void *pvVar1;
  queue_segment_data *data;
  mixed_segment *segment_local;
  void *value_local;
  uint32_t field_local;
  
  pvVar1 = segment->data;
  if (field == 1) {
    if ((*value & 1) == 0) {
      segment->mix = queue_segment_mix;
    }
    else {
      segment->mix = queue_segment_mix_bypass;
    }
    value_local._4_4_ = 1;
  }
  else if (field == 0x24) {
    value_local._4_4_ =
         queue_resize_buffers
                   ((mixed_buffer ***)((long)pvVar1 + 0x20),(uint32_t *)((long)pvVar1 + 0x28),*value
                   );
  }
  else if (field == 0x25) {
    value_local._4_4_ =
         queue_resize_buffers
                   ((mixed_buffer ***)((long)pvVar1 + 0x10),(uint32_t *)((long)pvVar1 + 0x18),*value
                   );
  }
  else {
    mixed_err(7);
    value_local._4_4_ = 0;
  }
  return value_local._4_4_;
}

Assistant:

int queue_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct queue_segment_data *data = (struct queue_segment_data *)segment->data;
  switch(field){
  case MIXED_BYPASS:
    if(*(bool *)value){
      segment->mix = queue_segment_mix_bypass;
    }else{
      segment->mix = queue_segment_mix;
    }
    break;
  case MIXED_IN_COUNT: return queue_resize_buffers(&data->in, &data->in_count, *(uint32_t *)value);
  case MIXED_OUT_COUNT: return queue_resize_buffers(&data->out, &data->out_count, *(uint32_t *)value);
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
  return 1;
}